

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.c
# Opt level: O1

int pipe_create(nni_pipe **pp,nni_sock *sock,nni_sp_tran *tran,nni_dialer *d,nni_listener *l)

{
  nni_stat_item *item;
  nni_stat_item *item_00;
  nni_sp_pipe_ops *pnVar1;
  _func_int_void_ptr_nni_pipe_ptr_void_ptr *p_Var2;
  _func_void_void_ptr *p_Var3;
  _func_int_void_ptr *p_Var4;
  _func_void_void_ptr *p_Var5;
  _func_void_void_ptr *p_Var6;
  int iVar7;
  uint32_t uVar8;
  int iVar9;
  int iVar10;
  void *pvVar11;
  nni_proto_pipe_ops *pnVar12;
  nni_pipe *p;
  long lVar13;
  void *pvVar14;
  nni_sp_pipe_ops *pnVar15;
  nni_sp_pipe_ops *pnVar16;
  nni_stat_item *pnVar17;
  size_t sz;
  byte bVar18;
  
  bVar18 = 0;
  pvVar11 = nni_sock_proto_data(sock);
  pnVar12 = nni_sock_proto_pipe_ops(sock);
  pnVar1 = tran->tran_pipe;
  sz = (pnVar12->pipe_size + 7 & 0xfffffffffffffff8) + (pnVar1->p_size + 7 & 0xfffffffffffffff8) +
       0x300;
  p = (nni_pipe *)nni_zalloc(sz);
  if (p == (nni_pipe *)0x0) {
    iVar10 = 2;
  }
  else {
    p->p_size = sz;
    p_Var2 = pnVar12->pipe_init;
    p_Var3 = pnVar12->pipe_fini;
    p_Var4 = pnVar12->pipe_start;
    p_Var5 = pnVar12->pipe_close;
    p_Var6 = pnVar12->pipe_stop;
    (p->p_proto_ops).pipe_size = pnVar12->pipe_size;
    (p->p_proto_ops).pipe_init = p_Var2;
    (p->p_proto_ops).pipe_fini = p_Var3;
    (p->p_proto_ops).pipe_start = p_Var4;
    (p->p_proto_ops).pipe_close = p_Var5;
    (p->p_proto_ops).pipe_stop = p_Var6;
    pnVar15 = pnVar1;
    pnVar16 = &p->p_tran_ops;
    for (lVar13 = 9; lVar13 != 0; lVar13 = lVar13 + -1) {
      pnVar16->p_size = pnVar15->p_size;
      pnVar15 = (nni_sp_pipe_ops *)((long)pnVar15 + (ulong)bVar18 * -0x10 + 8);
      pnVar16 = (nni_sp_pipe_ops *)((long)pnVar16 + (ulong)bVar18 * -0x10 + 8);
    }
    p->p_sock = sock;
    p->p_dialer = d;
    p->p_listener = l;
    p->p_last_event = NNG_PIPE_EV_NONE;
    nni_refcnt_init(&p->p_refcnt,2,p,pipe_destroy);
    nni_atomic_init_bool(&p->p_closed);
    nni_atomic_flag_reset(&p->p_stop);
    (p->p_ep_node).ln_next = (nni_list_node *)0x0;
    (p->p_ep_node).ln_prev = (nni_list_node *)0x0;
    (p->p_sock_node).ln_next = (nni_list_node *)0x0;
    (p->p_sock_node).ln_prev = (nni_list_node *)0x0;
    pvVar14 = (void *)((long)&p[1].p_id + (pnVar12->pipe_size + 7 & 0xfffffffffffffff8));
    nni_pipe_add(p);
    p->p_tran_data = pvVar14;
    p->p_proto_data = p + 1;
    nni_mtx_lock(&pipes_lk);
    iVar7 = nni_id_alloc32(&pipes,(uint32_t *)p,p);
    nni_mtx_unlock(&pipes_lk);
    item = &p->st_root;
    nni_stat_init(item,(nni_stat_info *)pipe_stats_init_root_info);
    pnVar17 = &p->st_id;
    nni_stat_init(pnVar17,(nni_stat_info *)pipe_stats_init_id_info);
    nni_stat_add(item,pnVar17);
    item_00 = &p->st_sock_id;
    nni_stat_init(item_00,(nni_stat_info *)pipe_stats_init_socket_info);
    nni_stat_add(item,item_00);
    nni_stat_init(&p->st_rx_msgs,(nni_stat_info *)pipe_stats_init_rx_msgs_info);
    nni_stat_add(item,&p->st_rx_msgs);
    nni_stat_init(&p->st_tx_msgs,(nni_stat_info *)pipe_stats_init_tx_msgs_info);
    nni_stat_add(item,&p->st_tx_msgs);
    nni_stat_init(&p->st_rx_bytes,(nni_stat_info *)pipe_stats_init_rx_bytes_info);
    nni_stat_add(item,&p->st_rx_bytes);
    nni_stat_init(&p->st_tx_bytes,(nni_stat_info *)pipe_stats_init_tx_bytes_info);
    nni_stat_add(item,&p->st_tx_bytes);
    nni_stat_set_id(item,p->p_id);
    nni_stat_set_id(pnVar17,p->p_id);
    uVar8 = nni_sock_id(p->p_sock);
    nni_stat_set_id(item_00,uVar8);
    if (p->p_dialer != (nni_dialer *)0x0) {
      if (p->p_listener != (nni_listener *)0x0) {
        nni_panic("%s: %d: assert err: %s",
                  "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/pipe.c",
                  0xe2,"p->p_listener == NULL");
      }
      pnVar17 = &p->st_ep_id;
      nni_stat_init(pnVar17,(nni_stat_info *)pipe_stats_init_dialer_info);
      nni_stat_add(item,pnVar17);
      uVar8 = nni_dialer_id(p->p_dialer);
      nni_stat_set_id(pnVar17,uVar8);
    }
    if (p->p_listener != (nni_listener *)0x0) {
      pnVar17 = &p->st_ep_id;
      nni_stat_init(pnVar17,(nni_stat_info *)pipe_stats_init_listener_info);
      nni_stat_add(item,pnVar17);
      uVar8 = nni_listener_id(p->p_listener);
      nni_stat_set_id(pnVar17,uVar8);
    }
    iVar9 = (*pnVar1->p_init)(pvVar14,p);
    iVar10 = (*pnVar12->pipe_init)(p + 1,p,pvVar11);
    if ((iVar7 == 0 && iVar9 == 0) && iVar10 == 0) {
      *pp = p;
      iVar10 = 0;
    }
    else {
      nni_pipe_close(p);
      nni_refcnt_rele(&p->p_refcnt);
      if (iVar9 != 0) {
        iVar10 = iVar9;
      }
      if (iVar7 != 0) {
        iVar10 = iVar7;
      }
    }
  }
  return iVar10;
}

Assistant:

static int
pipe_create(nni_pipe **pp, nni_sock *sock, nni_sp_tran *tran, nni_dialer *d,
    nni_listener *l)
{
	nni_pipe              *p;
	int                    rv1, rv2, rv3;
	void                  *sock_data = nni_sock_proto_data(sock);
	nni_proto_pipe_ops    *pops      = nni_sock_proto_pipe_ops(sock);
	const nni_sp_pipe_ops *tops      = tran->tran_pipe;
	size_t                 sz;

	sz = NNI_ALIGN_UP(sizeof(*p)) + NNI_ALIGN_UP(pops->pipe_size) +
	    NNI_ALIGN_UP(tops->p_size);

	if ((p = nni_zalloc(sz)) == NULL) {
		return (NNG_ENOMEM);
	}

	p->p_size       = sz;
	p->p_proto_ops  = *pops;
	p->p_tran_ops   = *tops;
	p->p_sock       = sock;
	p->p_dialer     = d;
	p->p_listener   = l;
	p->p_last_event = NNG_PIPE_EV_NONE;

	// Two references - one for our caller, and
	// one to be dropped when the pipe is closed.
	nni_refcnt_init(&p->p_refcnt, 2, p, pipe_destroy);

	nni_atomic_init_bool(&p->p_closed);
	nni_atomic_flag_reset(&p->p_stop);
	NNI_LIST_NODE_INIT(&p->p_sock_node);
	NNI_LIST_NODE_INIT(&p->p_ep_node);

	uint8_t *proto_data = (uint8_t *) p + NNI_ALIGN_UP(sizeof(*p));
	uint8_t *tran_data  = proto_data + NNI_ALIGN_UP(pops->pipe_size);
	nni_pipe_add(p);

	p->p_tran_data  = tran_data;
	p->p_proto_data = proto_data;

	nni_mtx_lock(&pipes_lk);
	rv1 = nni_id_alloc32(&pipes, &p->p_id, p);
	nni_mtx_unlock(&pipes_lk);

	// must be done before protocol or transports, because
	// they may add further stats
	pipe_stats_init(p);

	rv2 = tops->p_init(tran_data, p);
	rv3 = pops->pipe_init(proto_data, p, sock_data);
	if (rv1 != 0 || rv2 != 0 || rv3 != 0) {
		nni_pipe_close(p);
		nni_pipe_rele(p);
		return (rv1 ? rv1 : rv2 ? rv2 : rv3);
	}

	*pp = p;
	return (0);
}